

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

const_reference __thiscall
google::protobuf::RepeatedField<bool>::Get(RepeatedField<bool> *this,int index)

{
  bool is_soo;
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  bool *pbVar4;
  undefined1 auVar5 [16];
  LogMessageFatal local_68 [23];
  Voidify local_51;
  string *local_50;
  string *absl_log_internal_check_op_result_1;
  undefined8 local_40;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  RepeatedField<bool> *pRStack_10;
  int index_local;
  RepeatedField<bool> *this_local;
  
  absl_log_internal_check_op_result._4_4_ = index;
  pRStack_10 = this;
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(index);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(iVar1,iVar2,"index >= 0");
  if (local_20 != (string *)0x0) {
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    local_40 = auVar5._8_8_;
    absl_log_internal_check_op_result_1 = auVar5._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x326,absl_log_internal_check_op_result_1,local_40);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue
                    (absl_log_internal_check_op_result._4_4_);
  iVar2 = size(this);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar2);
  local_50 = absl::lts_20240722::log_internal::Check_LTImpl_abi_cxx11_(iVar1,iVar2,"index < size()")
  ;
  if (local_50 != (string *)0x0) {
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x327,auVar5._0_8_,auVar5._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_68);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_51,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_68);
  }
  is_soo = RepeatedField<bool>::is_soo(this);
  pbVar4 = elements(this,is_soo);
  return pbVar4 + absl_log_internal_check_op_result._4_4_;
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  ABSL_DCHECK_GE(index, 0);
  ABSL_DCHECK_LT(index, size());
  return elements(is_soo())[index];
}